

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementTabSet.cpp
# Opt level: O0

void __thiscall Rml::ElementTabSet::SetPanel(ElementTabSet *this,int tab_index,String *rml)

{
  pointer parent;
  unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> local_b0;
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  local_a8;
  allocator<char> local_81;
  String local_80;
  allocator<char> local_49;
  String local_48;
  unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> local_28;
  ElementPtr element;
  String *rml_local;
  int tab_index_local;
  ElementTabSet *this_local;
  
  element._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
  super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
  super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl =
       (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)
       (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)rml;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"*",&local_49);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"panel",&local_81);
  local_a8.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  itlib::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  ::flat_map(&local_a8);
  Factory::InstanceElement((Factory *)&local_28,(Element *)0x0,&local_48,&local_80,&local_a8);
  itlib::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  ::~flat_map(&local_a8);
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::allocator<char>::~allocator(&local_81);
  ::std::__cxx11::string::~string((string *)&local_48);
  ::std::allocator<char>::~allocator(&local_49);
  parent = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::get(&local_28);
  Factory::InstanceElementText
            (parent,(String *)
                    element._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
                    _M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                    super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl);
  ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::unique_ptr(&local_b0,&local_28);
  SetPanel(this,tab_index,&local_b0);
  ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr(&local_b0);
  ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr(&local_28);
  return;
}

Assistant:

void ElementTabSet::SetPanel(int tab_index, const String& rml)
{
	ElementPtr element = Factory::InstanceElement(nullptr, "*", "panel", XMLAttributes());
	Factory::InstanceElementText(element.get(), rml);
	SetPanel(tab_index, std::move(element));
}